

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool google::protobuf::internal::MergeFromImpl<true>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ParseFlags parse_flags_00;
  char *ptr;
  ZeroCopyInputStream *input_local;
  ParseContext ctx;
  
  input_local = input;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&ptr,&input_local);
  iVar2 = (*msg->_vptr_MessageLite[10])(msg,ptr,&ctx);
  ptr = (char *)CONCAT44(extraout_var,iVar2);
  bVar1 = false;
  if ((ptr != (char *)0x0) && (bVar1 = false, ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 1))
  {
    bVar1 = anon_unknown_13::CheckFieldPresence
                      ((ParseContext *)msg,(MessageLite *)(ulong)parse_flags,parse_flags_00);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}